

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int macro_dis_dst(char *out,uint32_t c)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  uint local_20;
  int expects_maddr;
  uint32_t c_local;
  char *out_local;
  
  pcVar4 = mcr_maddrsend;
  pcVar3 = mcr_parmsend;
  pcVar2 = mcr_send;
  pcVar1 = mcr_maddr;
  pcVar5 = mcr_mov;
  pcVar6 = mcr_parm;
  local_20 = 0;
  if ((c & 0x70) == 0) {
    pcVar5 = reg1_str(c);
    sprintf(out,"%s %s ign",pcVar6,pcVar5);
  }
  else if ((c & 0x70) == 0x10) {
    pcVar6 = reg1_str(c);
    sprintf(out,"%s %s",pcVar5,pcVar6);
  }
  else if ((c & 0x770) == 0x20) {
    sprintf(out,"%s",mcr_maddr);
    local_20 = 1;
  }
  else if ((c & 0x70) == 0x20) {
    pcVar6 = reg1_str(c);
    sprintf(out,"%s %s",pcVar1,pcVar6);
    local_20 = 1;
  }
  else if ((c & 0x70) == 0x30) {
    pcVar5 = reg1_str(c);
    sprintf(out,"%s %s %s",pcVar6,pcVar5,mcr_send);
  }
  else if ((c & 0x770) == 0x40) {
    sprintf(out,"%s",mcr_send);
  }
  else if ((c & 0x70) == 0x40) {
    pcVar6 = reg1_str(c);
    sprintf(out,"%s %s",pcVar2,pcVar6);
  }
  else {
    if ((c & 0x70) == 0x50) {
      pcVar5 = reg1_str(c);
      sprintf(out,"%s %s %s",pcVar6,pcVar5,mcr_maddr);
      return 1;
    }
    if ((c & 0x770) == 0x60) {
      sprintf(out,"%s %s",mcr_parmsend,mcr_maddr);
      local_20 = 1;
    }
    else if ((c & 0x70) == 0x60) {
      pcVar6 = reg1_str(c);
      sprintf(out,"%s %s %s",pcVar3,pcVar1,pcVar6);
      local_20 = 1;
    }
    else if ((c & 0x770) == 0x70) {
      sprintf(out,"%s",mcr_maddrsend);
      local_20 = 1;
    }
    else {
      bVar7 = (c & 0x70) != 0x70;
      if (bVar7) {
        sprintf(out,"???");
      }
      else {
        pcVar6 = reg1_str(c);
        sprintf(out,"%s %s",pcVar4,pcVar6);
      }
      local_20 = (uint)!bVar7;
    }
  }
  return local_20;
}

Assistant:

static int macro_dis_dst(char *out, uint32_t c)
{
	int expects_maddr = 0;
	if ((c & 0x00000070) == 0x00000000)
	{
		// { 0x00000000, 0x00000070, N("parm"), REG1, N("ign") }
		sprintf(out, "%s %s ign", mcr_parm, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000010)
	{
		// { 0x00000010, 0x00000070, N("mov"), REG1 }
		sprintf(out, "%s %s", mcr_mov, reg1_str(c));
	}
	else if ((c & 0x00000770) == 0x00000020)
	{
		// { 0x00000020, 0x00000770, N("maddr") }
		sprintf(out, "%s", mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000020)
	{
		// { 0x00000020, 0x00000070, N("maddr"), REG1 }
		sprintf(out, "%s %s", mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000030)
	{
		// { 0x00000030, 0x00000070, N("parm"), REG1, N("send") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_send);
	}
	else if ((c & 0x00000770) == 0x00000040)
	{
		// { 0x00000040, 0x00000770, N("send") }
		sprintf(out, "%s", mcr_send);
	}
	else if ((c & 0x00000070) == 0x00000040)
	{
		// { 0x00000040, 0x00000070, N("send"), REG1 }
		sprintf(out, "%s %s", mcr_send, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000050)
	{
		// { 0x00000050, 0x00000070, N("parm"), REG1, N("maddr") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_maddr);
		return 1;
	}
	else if ((c & 0x00000770) == 0x00000060)
	{
		// { 0x00000060, 0x00000770, N("parmsend"), N("maddr") }
		sprintf(out, "%s %s", mcr_parmsend, mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000060)
	{
		// { 0x00000060, 0x00000070, N("parmsend"), N("maddr"), REG1 }
		sprintf(out, "%s %s %s", mcr_parmsend, mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000770) == 0x00000070)
	{
		// { 0x00000070, 0x00000770, N("maddrsend") }
		sprintf(out, "%s", mcr_maddrsend);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000070)
	{
		// { 0x00000070, 0x00000070, N("maddrsend"), REG1 }
		sprintf(out, "%s %s", mcr_maddrsend, reg1_str(c));
		expects_maddr = 1;
	}
	else
		sprintf(out, "???");

	return expects_maddr;
}